

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::InlinePass::AddPointerToType
          (InlinePass *this,uint32_t type_id,StorageClass storage_class)

{
  IRContext *pIVar1;
  undefined8 type;
  uint32_t res_id;
  Instruction *this_00;
  pointer *__ptr_1;
  long lVar2;
  pointer *__ptr;
  default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *this_01;
  size_type __dnew;
  string message;
  undefined1 local_f8 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_d8;
  undefined1 local_d0 [32];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_b0;
  undefined1 local_a8 [16];
  IRContext *local_98;
  _Hash_node_base local_90;
  __node_base local_88;
  size_type local_80;
  float local_78;
  undefined1 local_70 [32];
  __node_base local_50;
  size_type local_48;
  _Prime_rehash_policy _Stack_40;
  
  pIVar1 = (this->super_Pass).context_;
  res_id = Module::TakeNextIdBound
                     ((pIVar1->module_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                      .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((res_id == 0) && ((pIVar1->consumer_).super__Function_base._M_manager != (_Manager_type)0x0))
  {
    local_f8._0_8_ = (IRContext *)0x25;
    local_a8._0_8_ = (MessageConsumer *)&local_98;
    local_a8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_a8,(ulong)local_f8);
    local_98 = (IRContext *)local_f8._0_8_;
    *(undefined8 *)&(((MessageConsumer *)local_a8._0_8_)->super__Function_base)._M_functor =
         0x667265766f204449;
    *(undefined8 *)
     ((long)&(((MessageConsumer *)local_a8._0_8_)->super__Function_base)._M_functor + 8) =
         0x797254202e776f6c;
    (((MessageConsumer *)local_a8._0_8_)->super__Function_base)._M_manager =
         (_Manager_type)0x676e696e6e757220;
    ((MessageConsumer *)local_a8._0_8_)->_M_invoker = (_Invoker_type)0x746361706d6f6320;
    *(undefined8 *)((long)&((MessageConsumer *)local_a8._0_8_)->_M_invoker + 5) = 0x2e7364692d746361
    ;
    local_a8._8_8_ = local_f8._0_8_;
    *(char *)((long)(spv_context *)local_f8._0_8_ +
             (long)&((MessageConsumer *)local_a8._0_8_)->super__Function_base) = '\0';
    local_f8._0_8_ = (_func_int **)0x0;
    local_f8._8_8_ = 0;
    local_f8._16_4_ = (array<signed_char,_4UL>)0x0;
    local_f8._20_4_ = (array<signed_char,_4UL>)0x0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&pIVar1->consumer_,SPV_MSG_ERROR,"",(spv_position_t *)local_f8,(char *)local_a8._0_8_
              );
    if ((MessageConsumer *)local_a8._0_8_ != (MessageConsumer *)&local_98) {
      operator_delete((void *)local_a8._0_8_,(ulong)((long)&local_98->syntax_context_ + 1));
    }
  }
  else if (res_id != 0) {
    this_00 = (Instruction *)operator_new(0x70);
    pIVar1 = (this->super_Pass).context_;
    local_f8._24_8_ = local_f8 + 0x10;
    local_f8._0_8_ = &PTR__SmallVector_003d7c78;
    local_d8._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_f8._16_4_ = storage_class;
    local_f8._8_8_ = 1;
    local_a8._0_4_ = 0x11;
    local_a8._8_8_ = &PTR__SmallVector_003d7c78;
    local_98 = (IRContext *)0x0;
    local_88._M_nxt = &local_90;
    local_80 = 0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)(local_a8 + 8),
               (SmallVector<unsigned_int,_2UL> *)local_f8);
    local_d0._24_8_ = local_d0 + 0x10;
    local_d0._0_8_ = &PTR__SmallVector_003d7c78;
    local_b0._M_t.
    super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
    _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )0x0;
    local_d0._8_8_ = 1;
    local_78 = 1.4013e-45;
    local_70._0_8_ = &PTR__SmallVector_003d7c78;
    local_70._8_8_ = (__node_base_ptr)0x0;
    local_70._24_8_ = local_70 + 0x10;
    this_01 = (default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)&local_50
    ;
    local_50._M_nxt = (_Hash_node_base *)0x0;
    local_d0._16_4_ = type_id;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)local_70,(SmallVector<unsigned_int,_2UL> *)local_d0
              );
    local_48 = 0;
    _Stack_40._M_max_load_factor = 0.0;
    _Stack_40._4_4_ = 0;
    _Stack_40._M_next_resize = 0;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_initialize<spvtools::opt::Operand_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
               local_a8,&local_48);
    Instruction::Instruction(this_00,pIVar1,OpTypePointer,0,res_id,(OperandList *)&local_48);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48)
    ;
    lVar2 = -0x60;
    do {
      *(undefined ***)(this_01 + -0x20) = &PTR__SmallVector_003d7c78;
      if (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_01 !=
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  (this_01,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)this_01);
      }
      *(undefined8 *)this_01 = 0;
      this_01 = this_01 + -0x30;
      lVar2 = lVar2 + 0x30;
    } while (lVar2 != 0);
    local_d0._0_8_ = &PTR__SmallVector_003d7c78;
    if (local_b0._M_t.
        super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
        _M_head_impl !=
        (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_b0,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_b0._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
    }
    local_f8._0_8_ = &PTR__SmallVector_003d7c78;
    if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         )local_d8._M_t.
          super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
          _M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_d8,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 local_d8._M_t.
                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                 ._M_head_impl);
    }
    pIVar1 = (this->super_Pass).context_;
    utils::IntrusiveList<spvtools::opt::Instruction>::push_back
              (&(((pIVar1->module_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                  .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                types_values_).super_IntrusiveList<spvtools::opt::Instruction>,this_00);
    if ((pIVar1->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
      analysis::DefUseManager::AnalyzeInstDefUse
                ((pIVar1->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,
                 *(Instruction **)
                  ((long)&(((pIVar1->module_)._M_t.
                            super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                            .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                          types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 0x18));
    }
    pIVar1 = (this->super_Pass).context_;
    if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
      IRContext::BuildTypeManager(pIVar1);
    }
    analysis::TypeManager::GetTypeAndPointerType
              ((TypeManager *)local_a8,
               (uint32_t)
               (pIVar1->type_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl,
               type_id);
    type = local_a8._8_8_;
    pIVar1 = (this->super_Pass).context_;
    if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
      IRContext::BuildTypeManager(pIVar1);
    }
    analysis::TypeManager::RegisterType
              ((pIVar1->type_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl,
               res_id,(Type *)type);
    (*(code *)(*(spv_context *)type)->opcode_table)(type);
  }
  return res_id;
}

Assistant:

uint32_t InlinePass::AddPointerToType(uint32_t type_id,
                                      spv::StorageClass storage_class) {
  uint32_t resultId = context()->TakeNextId();
  if (resultId == 0) {
    return resultId;
  }

  std::unique_ptr<Instruction> type_inst(
      new Instruction(context(), spv::Op::OpTypePointer, 0, resultId,
                      {{spv_operand_type_t::SPV_OPERAND_TYPE_STORAGE_CLASS,
                        {uint32_t(storage_class)}},
                       {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {type_id}}}));
  context()->AddType(std::move(type_inst));
  analysis::Type* pointeeTy;
  std::unique_ptr<analysis::Pointer> pointerTy;
  std::tie(pointeeTy, pointerTy) =
      context()->get_type_mgr()->GetTypeAndPointerType(
          type_id, spv::StorageClass::Function);
  context()->get_type_mgr()->RegisterType(resultId, *pointerTy);
  return resultId;
}